

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Vector *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  idx_t iVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  string_t sVar15;
  undefined1 auVar16 [16];
  UnifiedVectorFormat state_format;
  ulong local_c8;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a8;
  ulong local_a0;
  Vector *local_98;
  long local_90;
  idx_t local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  local_c8 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    iVar8 = 0;
    do {
      iVar9 = iVar8;
      if (*local_78 != 0) {
        iVar9 = (idx_t)*(uint *)(*local_78 + iVar8 * 4);
      }
      lVar11 = lVar11 + *(long *)(*(long *)(local_70 + iVar9 * 8) + 0x10);
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
  }
  duckdb::ListVector::Reserve(result,lVar11 + local_c8);
  local_90 = *(long *)(result + 0x20);
  pVVar6 = (Vector *)duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = result + 0x30;
    uVar12 = 0;
    local_a8 = result;
    local_a0 = count;
    do {
      uVar13 = uVar12;
      if (*local_78 != 0) {
        uVar13 = (ulong)*(uint *)(*local_78 + uVar12 * 4);
      }
      uVar14 = uVar12 + local_88;
      lVar11 = *(long *)(local_70 + uVar13 * 8);
      if ((*(char *)(lVar11 + 0x18) == '\x01') && (lVar2 = *(long *)(lVar11 + 0x10), lVar2 != 0)) {
        *(ulong *)(local_90 + uVar14 * 0x10) = local_c8;
        *(long *)(local_90 + 8 + uVar14 * 0x10) = lVar2;
        local_b8._M_comp =
             BinaryAggregateHeap<float,_duckdb::string_t,_duckdb::GreaterThan>::Compare;
        std::
        __sort_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                  (*(pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar11 + 8),
                   *(pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_> **)
                    (lVar11 + 8) + lVar2,&local_b8);
        if (*(long *)(lVar11 + 0x10) != 0) {
          puVar10 = (undefined8 *)(*(long *)(lVar11 + 8) + 0x10);
          uVar14 = local_c8 << 4 | 8;
          uVar13 = 0;
          do {
            sVar15.value.pointer.ptr = (char *)*puVar10;
            sVar15.value._0_8_ = puVar10[-1];
            auVar16 = duckdb::StringVector::AddStringOrBlob(pVVar6,sVar15);
            lVar2 = *(long *)(pVVar6 + 0x20);
            *(long *)(lVar2 + -8 + uVar14) = auVar16._0_8_;
            *(long *)(lVar2 + uVar14) = auVar16._8_8_;
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + 5;
            uVar14 = uVar14 + 0x10;
          } while (uVar13 < *(ulong *)(lVar11 + 0x10));
          local_c8 = local_c8 + uVar13;
          count = local_a0;
          result = local_a8;
        }
      }
      else {
        if (*(long *)(result + 0x28) == 0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var5 = p_Stack_b0;
          _Var4._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
                *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(_func_bool_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<duckdb::string_t>_>_ptr
            **)(result + 0x30) = _Var4._M_comp;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_98);
          *(unsigned_long **)(result + 0x28) =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar3 = (byte)uVar14 & 0x3f;
        puVar1 = (ulong *)(*(long *)(result + 0x28) + (uVar14 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  duckdb::ListVector::SetListSize(result,local_c8);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}